

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Transform * pbrt::LookAt(Transform *__return_storage_ptr__,Point3f *pos,Point3f *look,Vector3f *up)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [32];
  ulong uVar6;
  Float (*paFVar7) [4];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined8 local_a0;
  float local_98;
  SquareMatrix<4> cameraToWorld;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  undefined8 uStack_34;
  undefined8 uStack_2c;
  undefined8 uStack_24;
  undefined8 uStack_1c;
  char local_14;
  
  auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  paFVar7 = (Float (*) [4])&cameraToWorld;
  lVar8 = 0;
  do {
    auVar10 = vpbroadcastq_avx512vl();
    lVar8 = lVar8 + 1;
    uVar6 = vpcmpeqq_avx512vl(auVar10,auVar5);
    auVar11 = vpmovm2d_avx512vl(uVar6 & 0xf);
    auVar11 = vpsrld_avx(auVar11,0x1f);
    auVar11 = vcvtdq2ps_avx(auVar11);
    *paFVar7 = (Float  [4])auVar11;
    paFVar7 = paFVar7 + 1;
  } while (lVar8 != 4);
  cameraToWorld.m[2][3] = (pos->super_Tuple3<pbrt::Point3,_float>).z;
  cameraToWorld.m[3][3] = 1.0;
  fVar4 = (look->super_Tuple3<pbrt::Point3,_float>).z - cameraToWorld.m[2][3];
  uVar6._0_4_ = (pos->super_Tuple3<pbrt::Point3,_float>).x;
  uVar6._4_4_ = (pos->super_Tuple3<pbrt::Point3,_float>).y;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar6;
  cameraToWorld.m[1][3] = (Float)vextractps_avx(auVar11,1);
  uVar1 = (look->super_Tuple3<pbrt::Point3,_float>).x;
  uVar2 = (look->super_Tuple3<pbrt::Point3,_float>).y;
  auVar13._4_4_ = uVar2;
  auVar13._0_4_ = uVar1;
  auVar13._8_8_ = 0;
  fVar16 = (up->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar3 = vsubps_avx(auVar13,auVar11);
  fVar19 = (up->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar11 = vinsertps_avx(auVar3,ZEXT416((uint)(up->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar13 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar16),0x10);
  auVar9 = vpermi2ps_avx512vl(_DAT_004a9d60,auVar3,ZEXT416((uint)fVar19));
  auVar12._4_12_ = auVar11._4_12_;
  auVar12._0_4_ = fVar4;
  auVar17._0_4_ = auVar9._0_4_ * auVar9._0_4_;
  auVar17._4_4_ = auVar9._4_4_ * auVar9._4_4_;
  auVar17._8_4_ = auVar9._8_4_ * auVar9._8_4_;
  auVar17._12_4_ = auVar9._12_4_ * auVar9._12_4_;
  auVar11 = vfmadd231ps_fma(auVar17,auVar11,auVar11);
  auVar11 = vfmadd213ps_fma(auVar13,auVar13,auVar11);
  auVar13 = vsqrtps_avx(auVar11);
  uVar15 = auVar13._0_4_;
  auVar9._4_4_ = uVar15;
  auVar9._0_4_ = uVar15;
  auVar9._8_4_ = uVar15;
  auVar9._12_4_ = uVar15;
  auVar11 = vdivps_avx(auVar12,auVar13);
  auVar13 = vmovshdup_avx(auVar13);
  fVar19 = fVar19 / auVar13._0_4_;
  fVar16 = fVar16 / auVar13._0_4_;
  auVar13 = vdivps_avx(auVar3,auVar9);
  auVar3 = vmovshdup_avx(auVar13);
  local_a0 = vmovlps_avx(auVar13);
  local_98 = auVar11._0_4_;
  cameraToWorld.m[1][2] = auVar3._0_4_;
  auVar9 = vfmsub213ss_fma(auVar11,ZEXT416((uint)fVar19),
                           ZEXT416((uint)(cameraToWorld.m[1][2] * fVar16)));
  auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(cameraToWorld.m[1][2] * fVar16)),ZEXT416((uint)fVar16),
                             auVar3);
  fVar4 = auVar9._0_4_ + auVar12._0_4_;
  auVar9 = vmovshdup_avx(auVar11);
  auVar17 = ZEXT416((uint)(local_98 * auVar9._0_4_));
  auVar12 = vfmsub213ss_fma(ZEXT416((uint)fVar16),auVar13,auVar17);
  auVar17 = vfnmadd213ss_fma(auVar11,auVar9,auVar17);
  cameraToWorld.m[0][2] = auVar13._0_4_;
  auVar9 = vfmsub213ss_fma(auVar9,auVar3,ZEXT416((uint)(cameraToWorld.m[0][2] * fVar19)));
  auVar14 = vfnmadd213ss_fma(ZEXT416((uint)fVar19),auVar13,
                             ZEXT416((uint)(cameraToWorld.m[0][2] * fVar19)));
  fVar16 = auVar17._0_4_ + auVar12._0_4_;
  fVar19 = auVar9._0_4_ + auVar14._0_4_;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),ZEXT416((uint)fVar4),
                           ZEXT416((uint)fVar4));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  fVar21 = auVar9._0_4_;
  cameraToWorld.m[0][3] = (Float)(undefined4)uVar6;
  if ((fVar21 == 0.0) && (!NAN(fVar21))) {
    LogFatal<float_const&,float_const&,float_const&,float&,float&,float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/transform.cpp"
               ,0x5f,
               "LookAt: \"up\" vector (%f, %f, %f) and viewing direction (%f, %f, %f) passed to LookAt are pointing in the same direction."
               ,(float *)up,&(up->super_Tuple3<pbrt::Vector3,_float>).y,
               &(up->super_Tuple3<pbrt::Vector3,_float>).z,(float *)&local_a0,
               (float *)((long)&local_a0 + 4),&local_98);
  }
  auVar14._0_4_ = fVar4 / fVar21;
  auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar20._0_4_ = fVar19 / fVar21;
  auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar18._0_4_ = fVar16 / fVar21;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar12 = vfnmadd213ss_fma(auVar3,auVar14,ZEXT416((uint)(cameraToWorld.m[1][2] * auVar14._0_4_)));
  auVar9 = vfmsub213ss_fma(auVar14,auVar11,ZEXT416((uint)(cameraToWorld.m[0][2] * auVar20._0_4_)));
  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(cameraToWorld.m[0][2] * auVar20._0_4_)),auVar13,auVar20)
  ;
  auVar3 = vfmsub213ss_fma(auVar20,auVar3,ZEXT416((uint)(local_98 * auVar18._0_4_)));
  auVar11 = vfnmadd231ss_fma(ZEXT416((uint)(local_98 * auVar18._0_4_)),auVar11,auVar18);
  cameraToWorld.m[0][1] = auVar3._0_4_ + auVar11._0_4_;
  auVar11 = vfmsub213ss_fma(auVar13,auVar18,ZEXT416((uint)(cameraToWorld.m[1][2] * auVar14._0_4_)));
  cameraToWorld.m[1][1] = auVar9._0_4_ + auVar17._0_4_;
  cameraToWorld.m[2][1] = auVar12._0_4_ + auVar11._0_4_;
  cameraToWorld.m[3][0] = 0.0;
  cameraToWorld.m[3][1] = 0.0;
  cameraToWorld.m[3][2] = 0.0;
  cameraToWorld.m[0][0] = auVar14._0_4_;
  cameraToWorld.m[1][0] = auVar18._0_4_;
  cameraToWorld.m[2][0] = auVar20._0_4_;
  cameraToWorld.m[2][2] = local_98;
  Inverse<4>(&cameraToWorld);
  if (local_14 != '\0') {
    *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_54;
    *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = uStack_4c;
    *(undefined8 *)(__return_storage_ptr__->m).m[1] = uStack_44;
    *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = uStack_3c;
    *(undefined8 *)(__return_storage_ptr__->m).m[2] = uStack_34;
    *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = uStack_2c;
    *(undefined8 *)(__return_storage_ptr__->m).m[3] = uStack_24;
    *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = uStack_1c;
    *(ulong *)(__return_storage_ptr__->mInv).m[0] =
         CONCAT44(cameraToWorld.m[0][1],cameraToWorld.m[0][0]);
    *(ulong *)((__return_storage_ptr__->mInv).m[0] + 2) =
         CONCAT44(cameraToWorld.m[0][3],cameraToWorld.m[0][2]);
    *(ulong *)(__return_storage_ptr__->mInv).m[1] =
         CONCAT44(cameraToWorld.m[1][1],cameraToWorld.m[1][0]);
    *(ulong *)((__return_storage_ptr__->mInv).m[1] + 2) =
         CONCAT44(cameraToWorld.m[1][3],cameraToWorld.m[1][2]);
    *(ulong *)(__return_storage_ptr__->mInv).m[2] =
         CONCAT44(cameraToWorld.m[2][1],cameraToWorld.m[2][0]);
    *(ulong *)((__return_storage_ptr__->mInv).m[2] + 2) =
         CONCAT44(cameraToWorld.m[2][3],cameraToWorld.m[2][2]);
    *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = cameraToWorld.m[3]._0_8_;
    *(ulong *)((__return_storage_ptr__->mInv).m[3] + 2) =
         CONCAT44(cameraToWorld.m[3][3],cameraToWorld.m[3][2]);
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x2f54c6d);
}

Assistant:

Transform LookAt(const Point3f &pos, const Point3f &look, const Vector3f &up) {
    SquareMatrix<4> cameraToWorld;
    // Initialize fourth column of viewing matrix
    cameraToWorld[0][3] = pos.x;
    cameraToWorld[1][3] = pos.y;
    cameraToWorld[2][3] = pos.z;
    cameraToWorld[3][3] = 1;

    // Initialize first three columns of viewing matrix
    Vector3f dir = Normalize(look - pos);
    if (Length(Cross(Normalize(up), dir)) == 0)
        LOG_FATAL("LookAt: \"up\" vector (%f, %f, %f) and viewing direction "
                  "(%f, %f, %f) "
                  "passed to LookAt are pointing in the same direction.",
                  up.x, up.y, up.z, dir.x, dir.y, dir.z);
    Vector3f right = Normalize(Cross(Normalize(up), dir));
    Vector3f newUp = Cross(dir, right);
    cameraToWorld[0][0] = right.x;
    cameraToWorld[1][0] = right.y;
    cameraToWorld[2][0] = right.z;
    cameraToWorld[3][0] = 0.;
    cameraToWorld[0][1] = newUp.x;
    cameraToWorld[1][1] = newUp.y;
    cameraToWorld[2][1] = newUp.z;
    cameraToWorld[3][1] = 0.;
    cameraToWorld[0][2] = dir.x;
    cameraToWorld[1][2] = dir.y;
    cameraToWorld[2][2] = dir.z;
    cameraToWorld[3][2] = 0.;

    pstd::optional<SquareMatrix<4>> worldToCamera = Inverse(cameraToWorld);
#ifndef NDEBUG
    DCHECK(worldToCamera);
#endif  // !NDEBUG
    return Transform(*worldToCamera, cameraToWorld);
}